

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzdecomp.cpp
# Opt level: O0

lzham_decompress_status_t
lzham::lzham_lib_decompress
          (lzham_decompress_state_ptr p,lzham_uint8 *pIn_buf,size_t *pIn_buf_size,
          lzham_uint8 *pOut_buf,size_t *pOut_buf_size,lzham_bool no_more_input_bytes_flag)

{
  long in_RCX;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  long *in_R8;
  int in_R9D;
  lzham_decompress_status_t status;
  lzham_decompressor *pState;
  lzham_decompressor *in_stack_000003f8;
  lzham_decompress_status_t local_44;
  lzham_decompress_status_t local_4;
  
  if ((((in_RDI == 0) || (*(int *)(in_RDI + 0x58c) == 0)) || (in_RDX == (long *)0x0)) ||
     (in_R8 == (long *)0x0)) {
    local_4 = LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
  }
  else if ((*in_RDX == 0) || (in_RSI != 0)) {
    if ((*in_R8 == 0) || (in_RCX != 0)) {
      *(long *)(in_RDI + 0x550) = in_RSI;
      *(long **)(in_RDI + 0x558) = in_RDX;
      *(long *)(in_RDI + 0x560) = in_RCX;
      *(long **)(in_RDI + 0x568) = in_R8;
      *(bool *)(in_RDI + 0x570) = in_R9D != 0;
      if (*(int *)(in_RDI + 0x590) != 0) {
        if (*(long *)(in_RDI + 0x578) == 0) {
          *(long *)(in_RDI + 0x578) = in_RCX;
          *(long *)(in_RDI + 0x580) = *in_R8;
        }
        else if ((*(long *)(in_RDI + 0x578) != in_RCX) || (*(long *)(in_RDI + 0x580) != *in_R8)) {
          return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
        }
      }
      if (*(int *)(in_RDI + 0x590) == 0) {
        local_44 = lzham_decompressor::decompress<false>(in_stack_000003f8);
      }
      else {
        local_44 = lzham_decompressor::decompress<true>(in_stack_000003f8);
      }
      local_4 = local_44;
    }
    else {
      local_4 = LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
    }
  }
  else {
    local_4 = LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
  }
  return local_4;
}

Assistant:

lzham_decompress_status_t lzham_lib_decompress(
      lzham_decompress_state_ptr p,
      const lzham_uint8 *pIn_buf, size_t *pIn_buf_size,
      lzham_uint8 *pOut_buf, size_t *pOut_buf_size,
      lzham_bool no_more_input_bytes_flag)
   {
      lzham_decompressor *pState = static_cast<lzham_decompressor *>(p);

      if ((!pState) || (!pState->m_params.m_dict_size_log2) || (!pIn_buf_size) || (!pOut_buf_size))
      {
         return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
      }

      if ((*pIn_buf_size) && (!pIn_buf))
      {
         return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
      }

      if ((*pOut_buf_size) && (!pOut_buf))
      {
         return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
      }

      pState->m_pIn_buf = pIn_buf;
      pState->m_pIn_buf_size = pIn_buf_size;
      pState->m_pOut_buf = pOut_buf;
      pState->m_pOut_buf_size = pOut_buf_size;
      pState->m_no_more_input_bytes_flag = (no_more_input_bytes_flag != 0);

      if (pState->m_params.m_output_unbuffered)
      {
         if (!pState->m_pOrig_out_buf)
         {
            pState->m_pOrig_out_buf = pOut_buf;
            pState->m_orig_out_buf_size = *pOut_buf_size;
         }
         else
         {
            if ((pState->m_pOrig_out_buf != pOut_buf) || (pState->m_orig_out_buf_size != *pOut_buf_size))
            {
               return LZHAM_DECOMP_STATUS_INVALID_PARAMETER;
            }
         }
      }

      lzham_decompress_status_t status;
      if (pState->m_params.m_output_unbuffered)
         status = pState->decompress<true>();
      else
         status = pState->decompress<false>();

      //void *q = alloca(4096);
      //memset(q, 0xFE, 4096);

      return status;
   }